

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O0

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>
          (LAKBO *this,Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *t0,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *t1)

{
  uint uVar1;
  Result RVar2;
  anon_class_1_0_00000001 set;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff50;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff58;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff60;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff80;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff88;
  
  uVar1 = Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::nSummands
                    ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x8e5f39);
  if ((uVar1 == 1) &&
     (uVar1 = Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::nSummands
                        ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x8e5f4b),
     uVar1 == 1)) {
    Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::summandAt
              ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::summandAt
              ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    RVar2 = cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>
                      (in_stack_ffffffffffffff60.this,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
    return RVar2;
  }
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  const::{lambda(auto:1)#1}::operator()(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  const::{lambda(auto:1)#1}::operator()(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  RVar2 = OrderingUtils::
          mulExt<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::_lambda(auto:1&,auto:2&)_1_>
                    ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                     in_stack_ffffffffffffff58,
                     (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff60);
  MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~MultiSet
            ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)0x8e6030)
  ;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x8e603a);
  MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~MultiSet
            ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)0x8e6047)
  ;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x8e6054);
  return RVar2;
}

Assistant:

Ordering::Result cmpSameSkeleton(Polynom<NumTraits> const& t0, Polynom<NumTraits> const& t1) const 
  { 
    if (t0.nSummands() == 1 && t1.nSummands() == 1) {
      return cmpSameSkeleton(t0.summandAt(0), t1.summandAt(0));
    } else {
      auto set = [](auto p) { return p.iterSummands().map([](auto& x) { return x; }).template collect<MultiSet>(); };
      return OrderingUtils::mulExt(set(t0), set(t1), [&](auto& l, auto& r) { return compare(l, r); });
    }
  }